

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

ggml_tensor * __thiscall
llm_graph_context::build_norm
          (llm_graph_context *this,ggml_tensor *cur,ggml_tensor *mw,ggml_tensor *mb,
          llm_norm_type type,int il)

{
  undefined8 uVar1;
  long lVar2;
  llm_graph_context *in_RCX;
  long in_RDX;
  ggml_tensor *in_RSI;
  long in_RDI;
  int in_R8D;
  undefined4 in_R9D;
  int il_00;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  ggml_tensor *local_10;
  
  iVar3 = in_R8D;
  if (in_R8D == 0) {
    local_10 = (ggml_tensor *)
               ggml_norm(*(undefined4 *)(*(long *)(in_RDI + 8) + 0x1874),
                         *(undefined8 *)(in_RDI + 0xc0),in_RSI);
  }
  else if (in_R8D == 1) {
    local_10 = (ggml_tensor *)
               ggml_rms_norm(*(undefined4 *)(*(long *)(in_RDI + 8) + 0x1878),
                             *(undefined8 *)(in_RDI + 0xc0),in_RSI);
  }
  else {
    local_10 = in_RSI;
    if (in_R8D == 2) {
      uVar1 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),in_RSI,in_RSI->ne[0],1,in_RSI->ne[1]);
      lVar2 = ggml_group_norm(*(undefined4 *)(*(long *)(in_RDI + 8) + 0x187c),
                              *(undefined8 *)(in_RDI + 0xc0),uVar1,
                              *(undefined4 *)(*(long *)(in_RDI + 8) + 0x1864));
      local_10 = (ggml_tensor *)
                 ggml_reshape_2d(*(undefined8 *)(in_RDI + 0xc0),lVar2,*(undefined8 *)(lVar2 + 0x10),
                                 *(undefined8 *)(lVar2 + 0x20));
    }
  }
  il_00 = (int)((ulong)in_RDI >> 0x20);
  if ((in_RDX != 0) || (in_RCX != (llm_graph_context *)0x0)) {
    cb(in_RCX,(ggml_tensor *)CONCAT44(iVar3,in_R9D),
       (char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),il_00);
  }
  if ((in_RDX != 0) &&
     (local_10 = (ggml_tensor *)ggml_mul(*(undefined8 *)(in_RDI + 0xc0),local_10,in_RDX),
     in_RCX != (llm_graph_context *)0x0)) {
    cb(in_RCX,(ggml_tensor *)CONCAT44(iVar3,in_R9D),
       (char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),il_00);
  }
  if (in_RCX != (llm_graph_context *)0x0) {
    local_10 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),local_10,in_RCX);
  }
  return local_10;
}

Assistant:

ggml_tensor * llm_graph_context::build_norm(
         ggml_tensor * cur,
         ggml_tensor * mw,
         ggml_tensor * mb,
       llm_norm_type   type,
                 int   il) const {
    switch (type) {
        case LLM_NORM:       cur = ggml_norm    (ctx0, cur, hparams.f_norm_eps);     break;
        case LLM_NORM_RMS:   cur = ggml_rms_norm(ctx0, cur, hparams.f_norm_rms_eps); break;
        case LLM_NORM_GROUP:
            {
                cur = ggml_reshape_3d(ctx0, cur, cur->ne[0], 1, cur->ne[1]);
                cur = ggml_group_norm(ctx0, cur, hparams.n_norm_groups, hparams.f_norm_group_eps);
                cur = ggml_reshape_2d(ctx0, cur, cur->ne[0],    cur->ne[2]);
            } break;
    }

    if (mw || mb) {
        cb(cur, "norm", il);
    }

    if (mw) {
        cur = ggml_mul(ctx0, cur, mw);
        if (mb) {
            cb(cur, "norm_w", il);
        }
    }

    if (mb) {
        cur = ggml_add(ctx0, cur, mb);
    }

    return cur;
}